

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Type * __thiscall soul::AST::Constant::getResultType(Type *__return_storage_ptr__,Constant *this)

{
  Type::Type(__return_storage_ptr__,&(this->value).type);
  return __return_storage_ptr__;
}

Assistant:

Type getResultType() const override                 { return value.getType(); }